

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void * nk_buffer_alloc(nk_buffer *b,nk_buffer_allocation_type type,nk_size size,nk_size align)

{
  nk_plugin_alloc p_Var1;
  ulong length;
  bool bVar2;
  nk_size nVar3;
  uint uVar4;
  ulong uVar5;
  void *pvVar6;
  ulong uVar7;
  void *pvVar8;
  long lVar9;
  nk_size back_size;
  float fVar10;
  
  if (b == (nk_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x151f,
                  "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                 );
  }
  if (size == 0) {
    __assert_fail("size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x1520,
                  "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                 );
  }
  b->needed = b->needed + size;
  if (type == NK_BUFFER_FRONT) {
    nVar3 = b->allocated;
  }
  else {
    nVar3 = b->size - size;
  }
  pvVar8 = (void *)((long)(b->memory).ptr + nVar3);
  if (type == NK_BUFFER_BACK) {
    if (align == 0) {
LAB_00119b24:
      lVar9 = 0;
      pvVar6 = pvVar8;
    }
    else {
      pvVar6 = (void *)(-align & (ulong)pvVar8);
      lVar9 = (long)pvVar8 - (long)pvVar6;
    }
  }
  else {
    if (align == 0) goto LAB_00119b24;
    pvVar6 = (void *)(-align & (long)pvVar8 + (align - 1));
    lVar9 = (long)pvVar6 - (long)pvVar8;
  }
  if (type == NK_BUFFER_FRONT) {
    bVar2 = b->size < lVar9 + size + b->allocated;
  }
  else {
    bVar2 = b->size - (lVar9 + size) <= b->allocated;
  }
  if (bVar2) {
    if (b->type != NK_BUFFER_DYNAMIC) {
      __assert_fail("b->type == NK_BUFFER_DYNAMIC",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x1531,
                    "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                   );
    }
    p_Var1 = (b->pool).alloc;
    if ((p_Var1 == (nk_plugin_alloc)0x0) || ((b->pool).free == (nk_plugin_free)0x0)) {
      __assert_fail("b->pool.alloc && b->pool.free",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x1532,
                    "void *nk_buffer_alloc(struct nk_buffer *, enum nk_buffer_allocation_type, nk_size, nk_size)"
                   );
    }
    length = (b->memory).size;
    fVar10 = (float)length * b->grow_factor;
    uVar5 = (ulong)fVar10;
    uVar5 = (long)(fVar10 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
    uVar4 = ((int)b->allocated + (int)size) - 1;
    uVar4 = uVar4 >> 1 | uVar4;
    uVar4 = uVar4 >> 2 | uVar4;
    uVar4 = uVar4 >> 4 | uVar4;
    uVar4 = uVar4 >> 8 | uVar4;
    uVar7 = (ulong)((uVar4 >> 0x10 | uVar4) + 1);
    if (uVar5 <= uVar7) {
      uVar5 = uVar7;
    }
    pvVar8 = (*p_Var1)((b->pool).userdata,(b->memory).ptr,uVar5);
    if (pvVar8 == (void *)0x0) {
      __assert_fail("temp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x14fc,"void *nk_buffer_realloc(struct nk_buffer *, nk_size, nk_size *)");
    }
    (b->memory).size = uVar5;
    pvVar6 = (b->memory).ptr;
    if (pvVar8 != pvVar6) {
      nk_memcopy(pvVar8,pvVar6,length);
      (*(b->pool).free)((b->pool).userdata,(b->memory).ptr);
    }
    nVar3 = length - b->size;
    if (nVar3 != 0) {
      uVar5 = uVar5 - nVar3;
      nk_memcopy((void *)((long)pvVar8 + uVar5),(void *)(b->size + (long)pvVar8),nVar3);
    }
    b->size = uVar5;
    (b->memory).ptr = pvVar8;
    if (type == NK_BUFFER_FRONT) {
      nVar3 = b->allocated;
    }
    else {
      nVar3 = b->size - size;
    }
    pvVar8 = (void *)((long)pvVar8 + nVar3);
    if (type == NK_BUFFER_BACK) {
      if (align != 0) {
        pvVar6 = (void *)(-align & (ulong)pvVar8);
        lVar9 = (long)pvVar8 - (long)pvVar6;
        goto LAB_00119ca4;
      }
    }
    else if (align != 0) {
      pvVar6 = (void *)(-align & (long)pvVar8 + (align - 1));
      lVar9 = (long)pvVar6 - (long)pvVar8;
      goto LAB_00119ca4;
    }
    lVar9 = 0;
    pvVar6 = pvVar8;
  }
LAB_00119ca4:
  if (type == NK_BUFFER_FRONT) {
    b->allocated = b->allocated + size + lVar9;
  }
  else {
    b->size = b->size - (size + lVar9);
  }
  b->needed = b->needed + lVar9;
  b->calls = b->calls + 1;
  return pvVar6;
}

Assistant:

NK_INTERN void*
nk_buffer_alloc(struct nk_buffer *b, enum nk_buffer_allocation_type type,
    nk_size size, nk_size align)
{
    int full;
    nk_size alignment;
    void *unaligned;
    void *memory;

    NK_ASSERT(b);
    NK_ASSERT(size);
    if (!b || !size) return 0;
    b->needed += size;

    /* calculate total size with needed alignment + size */
    if (type == NK_BUFFER_FRONT)
        unaligned = nk_ptr_add(void, b->memory.ptr, b->allocated);
    else unaligned = nk_ptr_add(void, b->memory.ptr, b->size - size);
    memory = nk_buffer_align(unaligned, align, &alignment, type);

    /* check if buffer has enough memory*/
    if (type == NK_BUFFER_FRONT)
        full = ((b->allocated + size + alignment) > b->size);
    else full = ((b->size - (size + alignment)) <= b->allocated);

    if (full) {
        nk_size capacity;
        NK_ASSERT(b->type == NK_BUFFER_DYNAMIC);
        NK_ASSERT(b->pool.alloc && b->pool.free);
        if (b->type != NK_BUFFER_DYNAMIC || !b->pool.alloc || !b->pool.free)
            return 0;

        /* buffer is full so allocate bigger buffer if dynamic */
        capacity = (nk_size)((float)b->memory.size * b->grow_factor);
        capacity = NK_MAX(capacity, nk_round_up_pow2((nk_uint)(b->allocated + size)));
        b->memory.ptr = nk_buffer_realloc(b, capacity, &b->memory.size);
        if (!b->memory.ptr) return 0;

        /* align newly allocated pointer */
        if (type == NK_BUFFER_FRONT)
            unaligned = nk_ptr_add(void, b->memory.ptr, b->allocated);
        else unaligned = nk_ptr_add(void, b->memory.ptr, b->size - size);
        memory = nk_buffer_align(unaligned, align, &alignment, type);
    }

    if (type == NK_BUFFER_FRONT)
        b->allocated += size + alignment;
    else b->size -= (size + alignment);
    b->needed += alignment;
    b->calls++;
    return memory;
}